

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O3

void __thiscall
spirv_cross::Compiler::CombinedImageSamplerHandler::register_combined_image_sampler
          (CombinedImageSamplerHandler *this,SPIRFunction *caller,VariableID combined_module_id,
          VariableID image_id,VariableID sampler_id,bool depth)

{
  size_t *psVar1;
  Parameter *pPVar2;
  CombinedImageSamplerParameter *pCVar3;
  Compiler *pCVar4;
  undefined8 uVar5;
  Parameter *pPVar6;
  bool bVar7;
  undefined2 uVar8;
  Dim DVar9;
  bool bVar10;
  undefined1 uVar11;
  ImageFormat IVar12;
  AccessQualifier AVar13;
  TypeID TVar14;
  TypeID TVar15;
  ID IVar16;
  CombinedImageSamplerHandler *pCVar17;
  SPIRFunction *pSVar18;
  bool bVar19;
  uint32_t uVar20;
  uint32_t uVar21;
  SPIRType *pSVar22;
  SPIRType *pSVar23;
  SPIRType *pSVar24;
  long lVar25;
  long lVar26;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_2;
  Parameter *pPVar27;
  Parameter *pPVar28;
  ulong uVar29;
  size_t sVar30;
  CombinedImageSamplerParameter *pCVar31;
  long lVar32;
  VariableID VVar33;
  ID id;
  Parameter *pPVar34;
  VariableID VVar35;
  size_t sVar36;
  uint32_t ptr_type_id;
  bool local_f4;
  TypeID local_e4;
  undefined8 *local_e0;
  undefined4 local_d8;
  ID local_d4;
  ulong local_d0;
  SmallVector<unsigned_int,_8UL> *local_c8;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *local_c0;
  uint32_t *local_b8;
  SmallVector<bool,_8UL> *local_b0;
  SmallVector<unsigned_int,_8UL> *local_a8;
  CombinedImageSamplerHandler *local_a0;
  SPIRFunction *local_98;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pPVar2 = (caller->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.ptr;
  sVar36 = (caller->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.buffer_size;
  lVar25 = sVar36 * 0x14;
  pPVar6 = pPVar2 + sVar36;
  lVar26 = (long)sVar36 >> 2;
  pPVar27 = pPVar2;
  sVar30 = sVar36;
  if (0 < lVar26) {
    pPVar27 = pPVar2 + lVar26 * 4;
    lVar32 = lVar26 + 1;
    pPVar34 = pPVar2 + 2;
    do {
      if (pPVar34[-2].id.id == image_id.id) {
        pPVar34 = pPVar34 + -2;
        goto LAB_003870b5;
      }
      if (pPVar34[-1].id.id == image_id.id) {
        pPVar34 = pPVar34 + -1;
        goto LAB_003870b5;
      }
      if ((pPVar34->id).id == image_id.id) goto LAB_003870b5;
      if (pPVar34[1].id.id == image_id.id) {
        pPVar34 = pPVar34 + 1;
        goto LAB_003870b5;
      }
      lVar32 = lVar32 + -1;
      pPVar34 = pPVar34 + 4;
    } while (1 < lVar32);
    sVar30 = (lVar25 + lVar26 * -0x50 >> 2) * -0x3333333333333333;
  }
  if (sVar30 == 1) {
LAB_003870a9:
    pPVar34 = pPVar27;
    if ((pPVar27->id).id != image_id.id) {
      pPVar34 = pPVar6;
    }
  }
  else if (sVar30 == 2) {
LAB_00387088:
    pPVar34 = pPVar27;
    if ((pPVar27->id).id != image_id.id) {
      pPVar27 = pPVar27 + 1;
      goto LAB_003870a9;
    }
  }
  else {
    pPVar34 = pPVar6;
    if ((sVar30 == 3) && (pPVar34 = pPVar27, (pPVar27->id).id != image_id.id)) {
      pPVar27 = pPVar27 + 1;
      goto LAB_00387088;
    }
  }
LAB_003870b5:
  pPVar27 = pPVar2;
  if (0 < lVar26) {
    pPVar27 = pPVar2 + lVar26 * 4;
    lVar32 = lVar26 + 1;
    pPVar28 = pPVar2 + 2;
    do {
      if (pPVar28[-2].id.id == sampler_id.id) {
        pPVar28 = pPVar28 + -2;
        goto LAB_00387159;
      }
      if (pPVar28[-1].id.id == sampler_id.id) {
        pPVar28 = pPVar28 + -1;
        goto LAB_00387159;
      }
      if ((pPVar28->id).id == sampler_id.id) goto LAB_00387159;
      if (pPVar28[1].id.id == sampler_id.id) {
        pPVar28 = pPVar28 + 1;
        goto LAB_00387159;
      }
      lVar32 = lVar32 + -1;
      pPVar28 = pPVar28 + 4;
    } while (1 < lVar32);
    lVar25 = lVar25 + lVar26 * -0x50 >> 2;
    sVar36 = lVar25 * -0x3333333333333333;
  }
  if (sVar36 == 1) {
LAB_0038714d:
    pPVar28 = pPVar27;
    if ((pPVar27->id).id != sampler_id.id) {
      pPVar28 = pPVar6;
    }
  }
  else {
    pPVar28 = pPVar27;
    if (sVar36 == 2) {
LAB_0038712c:
      if ((pPVar28->id).id != sampler_id.id) {
        pPVar27 = pPVar28 + 1;
        goto LAB_0038714d;
      }
    }
    else {
      pPVar28 = pPVar6;
      if ((sVar36 == 3) && (pPVar28 = pPVar27, (pPVar27->id).id != sampler_id.id)) {
        pPVar28 = pPVar27 + 1;
        goto LAB_0038712c;
      }
    }
  }
LAB_00387159:
  local_d8 = (undefined4)CONCAT71((int7)((ulong)lVar25 >> 8),1);
  VVar33.id = image_id.id;
  if (pPVar34 != pPVar6) {
    VVar33.id = (int)((ulong)((long)pPVar34 - (long)pPVar2) >> 2) * -0x33333333;
  }
  local_f4 = pPVar34 == pPVar6;
  VVar35.id = sampler_id.id;
  if (pPVar28 != pPVar6) {
    VVar35.id = (int)((ulong)((long)pPVar28 - (long)pPVar2) >> 2) * -0x33333333;
    local_d8 = 0;
  }
  bVar19 = SUB41(local_d8,0);
  if ((local_f4) && (bVar19 != false)) {
    return;
  }
  pCVar3 = (caller->combined_parameters).
           super_VectorView<spirv_cross::SPIRFunction::CombinedImageSamplerParameter>.ptr;
  sVar36 = (caller->combined_parameters).
           super_VectorView<spirv_cross::SPIRFunction::CombinedImageSamplerParameter>.buffer_size;
  uVar29 = sVar36;
  pCVar31 = pCVar3;
  if (0 < (long)sVar36 >> 2) {
    lVar25 = ((long)sVar36 >> 2) + 1;
    pCVar31 = pCVar3 + 2;
    do {
      if ((((VVar33.id == pCVar31[-2].image_id.id) && (VVar35.id == pCVar31[-2].sampler_id.id)) &&
          (local_f4 == pCVar31[-2].global_image)) && (bVar19 == pCVar31[-2].global_sampler)) {
        pCVar31 = pCVar31 + -2;
        goto LAB_003872dd;
      }
      if (((VVar33.id == pCVar31[-1].image_id.id) && (VVar35.id == pCVar31[-1].sampler_id.id)) &&
         ((local_f4 == pCVar31[-1].global_image && (bVar19 == pCVar31[-1].global_sampler)))) {
        pCVar31 = pCVar31 + -1;
        goto LAB_003872dd;
      }
      if (((VVar33.id == (pCVar31->image_id).id) && (VVar35.id == (pCVar31->sampler_id).id)) &&
         ((local_f4 == pCVar31->global_image && (bVar19 == pCVar31->global_sampler))))
      goto LAB_003872dd;
      if ((((VVar33.id == pCVar31[1].image_id.id) && (VVar35.id == pCVar31[1].sampler_id.id)) &&
          (local_f4 == pCVar31[1].global_image)) && (bVar19 == pCVar31[1].global_sampler)) {
        pCVar31 = pCVar31 + 1;
        goto LAB_003872dd;
      }
      lVar25 = lVar25 + -1;
      pCVar31 = pCVar31 + 4;
    } while (1 < lVar25);
    uVar29 = (ulong)((uint)sVar36 & 3);
    pCVar31 = (CombinedImageSamplerParameter *)
              ((long)&(pCVar3->id).id + (sVar36 * 0x10 & 0xffffffffffffffc0));
  }
  if (uVar29 == 1) {
LAB_003872b0:
    if ((((VVar33.id != (pCVar31->image_id).id) || (VVar35.id != (pCVar31->sampler_id).id)) ||
        (local_f4 != pCVar31->global_image)) || (bVar19 != pCVar31->global_sampler))
    goto LAB_003872e9;
  }
  else if (uVar29 == 2) {
LAB_00387294:
    if (((VVar33.id != (pCVar31->image_id).id) || (VVar35.id != (pCVar31->sampler_id).id)) ||
       ((local_f4 != pCVar31->global_image || (bVar19 != pCVar31->global_sampler)))) {
      pCVar31 = pCVar31 + 1;
      goto LAB_003872b0;
    }
  }
  else {
    if (uVar29 != 3) goto LAB_003872e9;
    if (((VVar33.id != (pCVar31->image_id).id) || (VVar35.id != (pCVar31->sampler_id).id)) ||
       ((local_f4 != pCVar31->global_image || (bVar19 != pCVar31->global_sampler)))) {
      pCVar31 = pCVar31 + 1;
      goto LAB_00387294;
    }
  }
LAB_003872dd:
  if (pCVar31 != pCVar3 + sVar36) {
    return;
  }
LAB_003872e9:
  local_d4.id = sampler_id.id;
  local_98 = caller;
  uVar20 = ParsedIR::increase_bound_by(&this->compiler->ir,3);
  local_e4.id = uVar20 + 1;
  local_e0 = (undefined8 *)CONCAT44(local_e0._4_4_,local_e4.id);
  pCVar4 = this->compiler;
  uVar21 = expression_type_id(pCVar4,image_id.id);
  pSVar22 = Variant::get<spirv_cross::SPIRType>
                      ((pCVar4->ir).ids.super_VectorView<spirv_cross::Variant>.ptr + uVar21);
  local_90._M_dataplus._M_p._0_4_ = 0x1b;
  local_d0 = (ulong)uVar20;
  pSVar23 = set<spirv_cross::SPIRType,spv::Op>(this->compiler,uVar20,(Op *)&local_90);
  local_90._M_dataplus._M_p._0_4_ = 0x20;
  local_a0 = this;
  pSVar24 = set<spirv_cross::SPIRType,spv::Op>(this->compiler,(uint32_t)local_e0,(Op *)&local_90);
  (pSVar23->super_IVariant).self.id = (pSVar22->super_IVariant).self.id;
  local_e0 = (undefined8 *)&(pSVar23->super_IVariant).field_0xc;
  uVar20 = pSVar22->width;
  uVar21 = pSVar22->vecsize;
  *(undefined8 *)&(pSVar23->super_IVariant).field_0xc =
       *(undefined8 *)&(pSVar22->super_IVariant).field_0xc;
  pSVar23->width = uVar20;
  pSVar23->vecsize = uVar21;
  pSVar23->columns = pSVar22->columns;
  local_a8 = &pSVar23->array;
  SmallVector<unsigned_int,_8UL>::operator=(local_a8,&pSVar22->array);
  local_b0 = &pSVar23->array_size_literal;
  SmallVector<bool,_8UL>::operator=(local_b0,&pSVar22->array_size_literal);
  local_b8 = &pSVar23->pointer_depth;
  bVar19 = pSVar22->pointer;
  bVar7 = pSVar22->forward_pointer;
  uVar8 = *(undefined2 *)&pSVar22->field_0x7e;
  pSVar23->pointer_depth = pSVar22->pointer_depth;
  pSVar23->pointer = bVar19;
  pSVar23->forward_pointer = bVar7;
  *(undefined2 *)&pSVar23->field_0x7e = uVar8;
  pSVar23->storage = pSVar22->storage;
  local_c0 = &pSVar23->member_types;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::operator=
            (local_c0,&pSVar22->member_types);
  local_c8 = &pSVar23->member_type_index_redirection;
  SmallVector<unsigned_int,_8UL>::operator=(local_c8,&pSVar22->member_type_index_redirection);
  DVar9 = (pSVar22->image).dim;
  bVar19 = (pSVar22->image).depth;
  bVar7 = (pSVar22->image).arrayed;
  bVar10 = (pSVar22->image).ms;
  uVar11 = (pSVar22->image).field_0xb;
  uVar20 = (pSVar22->image).sampled;
  IVar12 = (pSVar22->image).format;
  AVar13 = (pSVar22->image).access;
  TVar14.id = (pSVar22->type_alias).id;
  TVar15.id = (pSVar22->parent_type).id;
  (pSVar23->image).type = (TypeID)(pSVar22->image).type.id;
  (pSVar23->image).dim = DVar9;
  (pSVar23->image).depth = bVar19;
  (pSVar23->image).arrayed = bVar7;
  (pSVar23->image).ms = bVar10;
  (pSVar23->image).field_0xb = uVar11;
  (pSVar23->image).sampled = uVar20;
  (pSVar23->image).format = IVar12;
  (pSVar23->image).access = AVar13;
  pSVar23->type_alias = (TypeID)TVar14.id;
  pSVar23->parent_type = (TypeID)TVar15.id;
  if (pSVar22 != pSVar23) {
    ::std::
    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&>
              ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)&pSVar23->member_name_cache,&(pSVar22->member_name_cache)._M_h);
  }
  uVar20 = (uint32_t)local_d0;
  id.id = uVar20 + 2;
  (pSVar23->super_IVariant).self.id = uVar20;
  pSVar23->basetype = SampledImage;
  pSVar23->pointer = false;
  pSVar23->storage = Generic;
  (pSVar23->image).depth = depth;
  (pSVar24->super_IVariant).self.id = uVar20;
  uVar5 = local_e0[1];
  *(undefined8 *)&(pSVar24->super_IVariant).field_0xc = *local_e0;
  pSVar24->width = (int)uVar5;
  pSVar24->vecsize = (int)((ulong)uVar5 >> 0x20);
  pSVar24->columns = *(uint32_t *)(local_e0 + 2);
  SmallVector<unsigned_int,_8UL>::operator=(&pSVar24->array,local_a8);
  SmallVector<bool,_8UL>::operator=(&pSVar24->array_size_literal,local_b0);
  uVar5 = *(undefined8 *)local_b8;
  pSVar24->pointer_depth = (int)uVar5;
  pSVar24->pointer = (bool)(char)((ulong)uVar5 >> 0x20);
  pSVar24->forward_pointer = (bool)(char)((ulong)uVar5 >> 0x28);
  *(short *)&pSVar24->field_0x7e = (short)((ulong)uVar5 >> 0x30);
  pSVar24->storage = local_b8[2];
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::operator=
            (&pSVar24->member_types,local_c0);
  SmallVector<unsigned_int,_8UL>::operator=(&pSVar24->member_type_index_redirection,local_c8);
  DVar9 = (pSVar23->image).dim;
  bVar19 = (pSVar23->image).depth;
  bVar7 = (pSVar23->image).arrayed;
  bVar10 = (pSVar23->image).ms;
  uVar11 = (pSVar23->image).field_0xb;
  uVar20 = (pSVar23->image).sampled;
  IVar12 = (pSVar23->image).format;
  AVar13 = (pSVar23->image).access;
  TVar14.id = (pSVar23->type_alias).id;
  TVar15.id = (pSVar23->parent_type).id;
  (pSVar24->image).type = (TypeID)(pSVar23->image).type.id;
  (pSVar24->image).dim = DVar9;
  (pSVar24->image).depth = bVar19;
  (pSVar24->image).arrayed = bVar7;
  (pSVar24->image).ms = bVar10;
  (pSVar24->image).field_0xb = uVar11;
  (pSVar24->image).sampled = uVar20;
  (pSVar24->image).format = IVar12;
  (pSVar24->image).access = AVar13;
  pSVar24->type_alias = (TypeID)TVar14.id;
  pSVar24->parent_type = (TypeID)TVar15.id;
  if (pSVar23 != pSVar24) {
    ::std::
    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&>
              ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)&pSVar24->member_name_cache,&(pSVar23->member_name_cache)._M_h);
  }
  pCVar17 = local_a0;
  pSVar24->pointer = true;
  pSVar24->storage = StorageClassUniformConstant;
  (pSVar24->parent_type).id = (uint32_t)local_d0;
  local_90._M_dataplus._M_p._0_4_ = 7;
  ts_2 = &local_70;
  local_70._M_dataplus._M_p._0_4_ = 0;
  set<spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass,int>
            (local_a0->compiler,id.id,&local_e4.id,(StorageClass *)&local_90,(int *)ts_2);
  IVar16.id = local_d4.id;
  bVar19 = ParsedIR::has_decoration(&pCVar17->compiler->ir,local_d4,DecorationRelaxedPrecision);
  if (((bVar19) ||
      (bVar19 = ParsedIR::has_decoration
                          (&pCVar17->compiler->ir,(ID)image_id.id,DecorationRelaxedPrecision),
      bVar19)) ||
     ((combined_module_id.id != 0 &&
      (bVar19 = ParsedIR::has_decoration
                          (&pCVar17->compiler->ir,(ID)combined_module_id.id,
                           DecorationRelaxedPrecision), bVar19)))) {
    ParsedIR::set_decoration(&pCVar17->compiler->ir,id,DecorationRelaxedPrecision,0);
  }
  pCVar4 = pCVar17->compiler;
  (*pCVar4->_vptr_Compiler[6])(&local_70,pCVar4,(ulong)image_id.id,1);
  (*pCVar17->compiler->_vptr_Compiler[6])(&local_50,pCVar17->compiler,(ulong)IVar16.id,1);
  pSVar18 = local_98;
  join<char_const(&)[21],std::__cxx11::string,std::__cxx11::string>
            (&local_90,(spirv_cross *)"SPIRV_Cross_Combined",(char (*) [21])&local_70,&local_50,ts_2
            );
  ParsedIR::set_name(&pCVar4->ir,id,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_90._M_dataplus._M_p._4_4_,local_90._M_dataplus._M_p._0_4_) !=
      &local_90.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_90._M_dataplus._M_p._4_4_,local_90._M_dataplus._M_p._0_4_));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_70._M_dataplus._M_p._4_4_,local_70._M_dataplus._M_p._0_4_) !=
      &local_70.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_70._M_dataplus._M_p._4_4_,local_70._M_dataplus._M_p._0_4_));
  }
  SmallVector<spirv_cross::SPIRFunction::CombinedImageSamplerParameter,_8UL>::reserve
            (&pSVar18->combined_parameters,
             (pSVar18->combined_parameters).
             super_VectorView<spirv_cross::SPIRFunction::CombinedImageSamplerParameter>.buffer_size
             + 1);
  TVar14.id = local_e4.id;
  pCVar31 = (pSVar18->combined_parameters).
            super_VectorView<spirv_cross::SPIRFunction::CombinedImageSamplerParameter>.ptr;
  sVar36 = (pSVar18->combined_parameters).
           super_VectorView<spirv_cross::SPIRFunction::CombinedImageSamplerParameter>.buffer_size;
  pCVar31[sVar36].id.id = id.id;
  pCVar31[sVar36].image_id.id = VVar33.id;
  pCVar31[sVar36].sampler_id.id = VVar35.id;
  pCVar31[sVar36].global_image = local_f4;
  pCVar31[sVar36].global_sampler = SUB41(local_d8,0);
  pCVar31[sVar36].depth = depth;
  (pSVar18->combined_parameters).
  super_VectorView<spirv_cross::SPIRFunction::CombinedImageSamplerParameter>.buffer_size =
       sVar36 + 1;
  SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL>::reserve
            (&pSVar18->shadow_arguments,
             (pSVar18->shadow_arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.
             buffer_size + 1);
  pPVar6 = (pSVar18->shadow_arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.ptr;
  sVar36 = (pSVar18->shadow_arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.
           buffer_size;
  pPVar6[sVar36].type.id = TVar14.id;
  pPVar6[sVar36].id.id = id.id;
  pPVar6[sVar36].read_count = 0;
  pPVar6[sVar36].write_count = 0;
  pPVar6[sVar36].alias_global_variable = true;
  psVar1 = &(pSVar18->shadow_arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>.
            buffer_size;
  *psVar1 = *psVar1 + 1;
  return;
}

Assistant:

void Compiler::CombinedImageSamplerHandler::register_combined_image_sampler(SPIRFunction &caller,
                                                                            VariableID combined_module_id,
                                                                            VariableID image_id, VariableID sampler_id,
                                                                            bool depth)
{
	// We now have a texture ID and a sampler ID which will either be found as a global
	// or a parameter in our own function. If both are global, they will not need a parameter,
	// otherwise, add it to our list.
	SPIRFunction::CombinedImageSamplerParameter param = {
		0u, image_id, sampler_id, true, true, depth,
	};

	auto texture_itr = find_if(begin(caller.arguments), end(caller.arguments),
	                           [image_id](const SPIRFunction::Parameter &p) { return p.id == image_id; });
	auto sampler_itr = find_if(begin(caller.arguments), end(caller.arguments),
	                           [sampler_id](const SPIRFunction::Parameter &p) { return p.id == sampler_id; });

	if (texture_itr != end(caller.arguments))
	{
		param.global_image = false;
		param.image_id = uint32_t(texture_itr - begin(caller.arguments));
	}

	if (sampler_itr != end(caller.arguments))
	{
		param.global_sampler = false;
		param.sampler_id = uint32_t(sampler_itr - begin(caller.arguments));
	}

	if (param.global_image && param.global_sampler)
		return;

	auto itr = find_if(begin(caller.combined_parameters), end(caller.combined_parameters),
	                   [&param](const SPIRFunction::CombinedImageSamplerParameter &p) {
		                   return param.image_id == p.image_id && param.sampler_id == p.sampler_id &&
		                          param.global_image == p.global_image && param.global_sampler == p.global_sampler;
	                   });

	if (itr == end(caller.combined_parameters))
	{
		uint32_t id = compiler.ir.increase_bound_by(3);
		auto type_id = id + 0;
		auto ptr_type_id = id + 1;
		auto combined_id = id + 2;
		auto &base = compiler.expression_type(image_id);
		auto &type = compiler.set<SPIRType>(type_id, OpTypeSampledImage);
		auto &ptr_type = compiler.set<SPIRType>(ptr_type_id, OpTypePointer);

		type = base;
		type.self = type_id;
		type.basetype = SPIRType::SampledImage;
		type.pointer = false;
		type.storage = StorageClassGeneric;
		type.image.depth = depth;

		ptr_type = type;
		ptr_type.pointer = true;
		ptr_type.storage = StorageClassUniformConstant;
		ptr_type.parent_type = type_id;

		// Build new variable.
		compiler.set<SPIRVariable>(combined_id, ptr_type_id, StorageClassFunction, 0);

		// Inherit RelaxedPrecision.
		// If any of OpSampledImage, underlying image or sampler are marked, inherit the decoration.
		bool relaxed_precision =
		    compiler.has_decoration(sampler_id, DecorationRelaxedPrecision) ||
		    compiler.has_decoration(image_id, DecorationRelaxedPrecision) ||
		    (combined_module_id && compiler.has_decoration(combined_module_id, DecorationRelaxedPrecision));

		if (relaxed_precision)
			compiler.set_decoration(combined_id, DecorationRelaxedPrecision);

		param.id = combined_id;

		compiler.set_name(combined_id,
		                  join("SPIRV_Cross_Combined", compiler.to_name(image_id), compiler.to_name(sampler_id)));

		caller.combined_parameters.push_back(param);
		caller.shadow_arguments.push_back({ ptr_type_id, combined_id, 0u, 0u, true });
	}
}